

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

Logger * google::base::GetLogger(LogSeverity severity)

{
  Logger *pLVar1;
  int iVar2;
  tuple<google::LogDestination_*,_std::default_delete<google::LogDestination>_> in_RAX;
  LogDestination *pLVar3;
  pointer __p;
  __uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> local_28;
  
  local_28._M_t.
  super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>.
  super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl =
       (tuple<google::LogDestination_*,_std::default_delete<google::LogDestination>_>)
       (tuple<google::LogDestination_*,_std::default_delete<google::LogDestination>_>)
       in_RAX.
       super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
       .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)log_mutex);
  if (iVar2 == 0) {
    pLVar3 = (LogDestination *)(&LogDestination::log_destinations_)[severity];
    if (pLVar3 == (LogDestination *)0x0) {
      pLVar3 = (LogDestination *)operator_new(0xd0);
      LogDestination::LogDestination(pLVar3,severity,(char *)0x0);
      local_28._M_t.
      super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
      .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl =
           (tuple<google::LogDestination_*,_std::default_delete<google::LogDestination>_>)
           (_Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
           )0x0;
      std::__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>::
      reset((__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *
            )(&LogDestination::log_destinations_ + severity),pLVar3);
      std::unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>::
      ~unique_ptr((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>
                   *)&local_28);
      pLVar3 = (((__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>
                  *)(&LogDestination::log_destinations_ + severity))->_M_t).
               super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
               .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl;
    }
    pLVar1 = pLVar3->logger_;
    pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
    return pLVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

base::Logger* base::GetLogger(LogSeverity severity) {
  std::lock_guard<std::mutex> l{log_mutex};
  return LogDestination::log_destination(severity)->GetLoggerImpl();
}